

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# g12s.c
# Opt level: O2

err_t g12sKeypairGen(octet *privkey,octet *pubkey,g12s_params *params,gen_i rng,void *rng_stack)

{
  word *b;
  u32 uVar1;
  qr_o *pqVar2;
  ec_o *ec_00;
  err_t eVar3;
  bool_t bVar4;
  ulong n;
  word *stack;
  word *a;
  ulong count;
  ec_o *ec;
  size_t local_38;
  
  ec = (ec_o *)0x0;
  eVar3 = 0x130;
  if ((rng != (gen_i)0x0) && (eVar3 = g12sEcCreate(&ec,params,g12sKeypairGen_deep), eVar3 == 0)) {
    uVar1 = params->l;
    count = (ulong)(uVar1 + 7 >> 3);
    bVar4 = memIsValid(privkey,count);
    ec_00 = ec;
    if ((bVar4 != 0) && (bVar4 = memIsValid(pubkey,ec->f->no * 2), bVar4 != 0)) {
      n = (ulong)(uVar1 + 0x3f >> 6);
      a = (word *)((long)&(ec_00->hdr).keep + (ec_00->hdr).keep);
      local_38 = ec_00->f->n;
      bVar4 = zzRandNZMod(a,ec_00->order,n,rng,rng_stack);
      if (bVar4 == 0) {
        blobClose(ec_00);
        return 0x130;
      }
      b = a + n;
      stack = b + local_38 * 2;
      bVar4 = ecMulA(b,ec_00->base,ec_00,a,n,stack);
      if (bVar4 != 0) {
        u64To(privkey,count,a);
        (*ec_00->f->to)(pubkey,b,ec_00->f,stack);
        pqVar2 = ec_00->f;
        (*pqVar2->to)(pubkey + pqVar2->no,b + pqVar2->n,pqVar2,stack);
        blobClose(ec_00);
        return 0;
      }
      blobClose(ec_00);
      return 0x1f6;
    }
    blobClose(ec_00);
    eVar3 = 0x6d;
  }
  return eVar3;
}

Assistant:

err_t g12sKeypairGen(octet privkey[], octet pubkey[],
	const g12s_params* params, gen_i rng, void* rng_stack)
{
	err_t code;
	size_t m, mo;
	// состояние
	ec_o* ec = 0;
	word* d;				/* [m] личный ключ */
	word* Q;				/* [2n] открытый ключ */	
	void* stack;
	// проверить rng
	if (rng == 0)
		return ERR_BAD_RNG;
	// старт
	code = g12sEcCreate(&ec, params, g12sKeypairGen_deep);
	ERR_CALL_CHECK(code);
	// размерности order
	m = W_OF_B(params->l);
	mo = O_OF_B(params->l);
	// проверить входные указатели
	if (!memIsValid(privkey, mo) || 
		!memIsValid(pubkey, 2 * ec->f->no))
	{
		g12sEcClose(ec);
		return ERR_BAD_INPUT;
	}
	// раскладка состояния
	d = objEnd(ec, word);
	Q = d + m;
	stack = Q + 2 * ec->f->n;
	// d <-R {1,2,..., q - 1}
	if (!zzRandNZMod(d, ec->order, m, rng, rng_stack))
	{
		g12sEcClose(ec);
		return ERR_BAD_RNG;
	}
	// Q <- d P
	if (!ecMulA(Q, ec->base, ec, d, m, stack))
	{
		g12sEcClose(ec);
		return ERR_BAD_PARAMS;
	}
	// выгрузить ключи
	wwTo(privkey, mo, d);
	qrTo(pubkey, ecX(Q), ec->f, stack);
	qrTo(pubkey + ec->f->no, ecY(Q, ec->f->n), ec->f, stack);
	// все нормально
	g12sEcClose(ec);
	return ERR_OK;
}